

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O0

int __thiscall deqp::gles31::bb::BufferLayout::getBlockIndex(BufferLayout *this,string *name)

{
  __type _Var1;
  size_type sVar2;
  const_reference __lhs;
  int local_24;
  int ndx;
  string *name_local;
  BufferLayout *this_local;
  
  local_24 = 0;
  while( true ) {
    sVar2 = std::
            vector<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
            ::size(&this->blocks);
    if ((int)sVar2 <= local_24) {
      return -1;
    }
    __lhs = std::
            vector<deqp::gles31::bb::BlockLayoutEntry,_std::allocator<deqp::gles31::bb::BlockLayoutEntry>_>
            ::operator[](&this->blocks,(long)local_24);
    _Var1 = std::operator==(&__lhs->name,name);
    if (_Var1) break;
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

int BufferLayout::getBlockIndex (const string& name) const
{
	for (int ndx = 0; ndx < (int)blocks.size(); ndx++)
	{
		if (blocks[ndx].name == name)
			return ndx;
	}
	return -1;
}